

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring_bitmap_to_bitset(roaring_bitmap_t *r,bitset_t *bitset)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  long lVar4;
  _Bool _Var5;
  uint32_t uVar6;
  array_container_t *src;
  int *piVar7;
  uint8_t uVar8;
  ulong uVar9;
  uint uVar10;
  ulong newarraysize;
  uint uVar11;
  long lVar12;
  uint64_t *words;
  uint uVar13;
  long lVar14;
  
  uVar6 = roaring_bitmap_maximum(r);
  newarraysize = (ulong)uVar6 + 0x3f >> 6;
  _Var5 = bitset_resize(bitset,newarraysize,true);
  if ((_Var5) && (0 < (r->high_low_container).size)) {
    lVar12 = 0;
    do {
      uVar8 = (r->high_low_container).typecodes[lVar12];
      piVar7 = (int *)(r->high_low_container).containers[lVar12];
      if (uVar8 == '\x04') {
        uVar8 = (uint8_t)piVar7[2];
        piVar7 = *(int **)piVar7;
      }
      uVar1 = (r->high_low_container).keys[lVar12];
      words = bitset->array + (ulong)uVar1 * 0x400;
      if (uVar8 == '\x01') {
        uVar9 = newarraysize + (ulong)uVar1 * -0x400;
        if (0x3ff < uVar9) {
          uVar9 = 0x400;
        }
        memcpy(words,*(void **)(piVar7 + 2),(ulong)(uint)((int)uVar9 << 3));
      }
      else if (uVar8 == '\x02') {
        bitset_set_list(words,*(uint16_t **)(piVar7 + 2),(long)*piVar7);
      }
      else {
        iVar3 = *piVar7;
        if (0 < (long)iVar3) {
          lVar4 = *(long *)(piVar7 + 2);
          lVar14 = 0;
          do {
            uVar1 = *(ushort *)(lVar4 + lVar14 * 4);
            uVar2 = *(ushort *)(lVar4 + 2 + lVar14 * 4);
            uVar13 = (uint)uVar2 + (uint)uVar1;
            uVar10 = (uint)(uVar1 >> 6);
            uVar11 = uVar13 >> 6;
            if (uVar11 - uVar10 == 0) {
              words[uVar10] =
                   words[uVar10] |
                   (0xffffffffffffffffU >> (0x3fU - (char)uVar2 & 0x3f)) << ((byte)uVar1 & 0x3f);
            }
            else {
              uVar9 = words[uVar11];
              words[uVar10] = words[uVar10] | -1L << ((byte)uVar1 & 0x3f);
              if (uVar10 + 1 < uVar11) {
                memset(words + (ulong)(uVar1 >> 6) + 1,0xff,
                       (ulong)((uVar11 - uVar10) - 2 >> 1) * 0x10 + 0x10);
              }
              words[uVar11] = uVar9 | 0xffffffffffffffffU >> (~(byte)uVar13 & 0x3f);
            }
            lVar14 = lVar14 + 1;
          } while (iVar3 != lVar14);
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < (r->high_low_container).size);
  }
  return _Var5;
}

Assistant:

bool roaring_bitmap_to_bitset(const roaring_bitmap_t *r, bitset_t *bitset) {
    uint32_t max_value = roaring_bitmap_maximum(r);
    size_t new_array_size = (size_t)(((uint64_t)max_value + 63) / 64);
    bool resize_ok = bitset_resize(bitset, new_array_size, true);
    if (!resize_ok) {
        return false;
    }
    const roaring_array_t *ra = &r->high_low_container;
    for (int i = 0; i < ra->size; ++i) {
        uint64_t *words = bitset->array + (ra->keys[i] << 10);
        uint8_t type = ra->typecodes[i];
        const container_t *c = ra->containers[i];
        if (type == SHARED_CONTAINER_TYPE) {
            c = container_unwrap_shared(c, &type);
        }
        switch (type) {
            case BITSET_CONTAINER_TYPE: {
                size_t max_word_index = new_array_size - (ra->keys[i] << 10);
                if (max_word_index > 1024) {
                    max_word_index = 1024;
                }
                const bitset_container_t *src = const_CAST_bitset(c);
                memcpy(words, src->words, max_word_index * sizeof(uint64_t));
            } break;
            case ARRAY_CONTAINER_TYPE: {
                const array_container_t *src = const_CAST_array(c);
                bitset_set_list(words, src->array, src->cardinality);
            } break;
            case RUN_CONTAINER_TYPE: {
                const run_container_t *src = const_CAST_run(c);
                for (int32_t rlepos = 0; rlepos < src->n_runs; ++rlepos) {
                    rle16_t rle = src->runs[rlepos];
                    bitset_set_lenrange(words, rle.value, rle.length);
                }
            } break;
            default:
                roaring_unreachable;
        }
    }
    return true;
}